

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

vector<glu::DataType,_std::allocator<glu::DataType>_> * __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::getSamplerTypes
          (vector<glu::DataType,_std::allocator<glu::DataType>_> *__return_storage_ptr__,
          UniformCollection *this)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_20;
  int i;
  UniformCollection *this_local;
  vector<glu::DataType,_std::allocator<glu::DataType>_> *samplerTypes;
  
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::vector(__return_storage_ptr__);
  for (local_20 = 0;
      sVar1 = std::
              vector<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
              ::size(&this->m_uniforms), local_20 < (int)sVar1; local_20 = local_20 + 1) {
    pvVar2 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
             ::operator[](&this->m_uniforms,(long)local_20);
    getDistinctSamplerTypes(__return_storage_ptr__,&pvVar2->type);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<glu::DataType> getSamplerTypes (void) const
	{
		vector<glu::DataType> samplerTypes;
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			getDistinctSamplerTypes(samplerTypes, m_uniforms[i].type);
		return samplerTypes;
	}